

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O3

InsertOrderedSet<wasm::Name> * __thiscall
wasm::InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>::operator[]
          (InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *this,Name *k)

{
  char **this_00;
  undefined8 *puVar1;
  _Hash_node_base *p_Var2;
  undefined8 *puVar3;
  pair<std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>,_bool>
  pVar4;
  undefined1 auStack_d8 [8];
  pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> kv;
  undefined8 uStack_48;
  undefined8 *local_40;
  undefined8 *local_38;
  undefined8 local_30;
  
  kv.second.List.super__List_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl._M_node._M_size =
       (size_t)&stack0xffffffffffffffb8;
  uStack_48 = 0;
  local_30 = 0;
  auStack_d8 = (undefined1  [8])(k->super_IString).str._M_len;
  kv.first.super_IString.str._M_len = (size_t)(k->super_IString).str._M_str;
  this_00 = &kv.first.super_IString.str._M_str;
  local_40 = &stack0xffffffffffffffc0;
  local_38 = &stack0xffffffffffffffc0;
  InsertOrderedSet<wasm::Name>::InsertOrderedSet
            ((InsertOrderedSet<wasm::Name> *)this_00,
             (InsertOrderedSet<wasm::Name> *)
             &kv.second.List.super__List_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              _M_node._M_size);
  puVar3 = local_40;
  while ((undefined8 **)puVar3 != &stack0xffffffffffffffc0) {
    puVar1 = (undefined8 *)*puVar3;
    operator_delete(puVar3,0x20);
    puVar3 = puVar1;
  }
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<wasm::Name>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<wasm::Name>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&kv.second.List.super__List_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                    ._M_node._M_size);
  pVar4 = insert(this,(pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *)auStack_d8);
  while (kv.second.Map._M_h._M_single_bucket !=
         (__node_base_ptr)&kv.second.Map._M_h._M_single_bucket) {
    p_Var2 = (kv.second.Map._M_h._M_single_bucket)->_M_nxt;
    operator_delete(kv.second.Map._M_h._M_single_bucket,0x20);
    kv.second.Map._M_h._M_single_bucket = p_Var2;
  }
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<wasm::Name>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<wasm::Name>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this_00);
  return (InsertOrderedSet<wasm::Name> *)(pVar4.first._M_node._M_node + 2);
}

Assistant:

T& operator[](const Key& k) {
    std::pair<const Key, T> kv = {k, {}};
    return insert(kv).first->second;
  }